

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_59e0::ktxStreamTest_CanCreateKtx1FromCppStream_Test::TestBody
          (ktxStreamTest_CanCreateKtx1FromCppStream_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  ktxStream *pkVar3;
  StreambufStream *this_00;
  undefined8 uVar4;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ktx_error_code_e err;
  KtxTexture<ktxTexture1> texture1;
  StreambufStream ktx1Stream;
  char (*in_stack_fffffffffffffeb8) [64];
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  KtxTexture<ktxTexture1> *in_stack_fffffffffffffec8;
  KtxTexture<ktxTexture1> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  int line;
  Message *in_stack_fffffffffffffee0;
  unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffee8;
  Type type;
  StreambufStream *in_stack_fffffffffffffef0;
  string local_f0 [16];
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  AssertionResult *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined1 uVar5;
  AssertionResult local_b8;
  uint local_a4;
  undefined8 local_90;
  AssertionResult local_88;
  undefined8 local_70;
  undefined4 local_5c;
  AssertionResult local_58;
  undefined4 local_48;
  KtxTexture<ktxTexture1> local_38;
  StreambufStream local_30;
  
  StreambufStream::StreambufStream
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (openmode)((ulong)in_stack_fffffffffffffee0 >> 0x20));
  type = (Type)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  KtxTexture<ktxTexture1>::KtxTexture(&local_38,(nullptr_t)0x0);
  pkVar3 = StreambufStream::stream((StreambufStream *)0x10cc4d);
  this_00 = (StreambufStream *)KtxTexture<ktxTexture1>::pHandle<ktxTexture1>(&local_38);
  local_48 = ktxTexture1_CreateFromStream(pkVar3,1,this_00);
  local_5c = 0;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            (in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
             (ktx_error_code_e *)in_stack_fffffffffffffec8,
             (ktx_error_code_e *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffef0);
    in_stack_fffffffffffffef0 =
         (StreambufStream *)
         testing::Message::operator<<
                   ((Message *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                    (char (*) [40])in_stack_fffffffffffffeb8);
    uVar4 = ktxErrorString(local_48);
    local_70 = uVar4;
    in_stack_fffffffffffffee0 =
         testing::Message::operator<<
                   ((Message *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                    (char **)in_stack_fffffffffffffeb8);
    type = (Type)((ulong)uVar4 >> 0x20);
    in_stack_fffffffffffffed8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10cd7f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffef0,type,(char *)in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(char *)in_stack_fffffffffffffed0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               (Message *)in_stack_ffffffffffffff38);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    testing::Message::~Message((Message *)0x10cdd9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ce47);
  local_90 = 0;
  testing::internal::CmpHelperNE<(anonymous_namespace)::KtxTexture<ktxTexture1>,decltype(nullptr)>
            (in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (void **)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  line = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffef0);
    in_stack_fffffffffffffed0 =
         (KtxTexture<ktxTexture1> *)
         testing::Message::operator<<
                   ((Message *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                    (char (*) [27])in_stack_fffffffffffffeb8);
    testing::AssertionResult::failure_message((AssertionResult *)0x10cee1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffef0,type,(char *)in_stack_fffffffffffffee0,line
               ,(char *)in_stack_fffffffffffffed0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               (Message *)in_stack_ffffffffffffff38);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    testing::Message::~Message((Message *)0x10cf3b);
  }
  local_a4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cfbf);
  if (local_a4 == 0) {
    uVar2 = StreambufStream::destructed(&local_30);
    uVar5 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT17(uVar2,in_stack_fffffffffffffec0),
               (bool *)in_stack_fffffffffffffeb8,(type *)0x10d009);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffef0);
      testing::Message::operator<<
                ((Message *)CONCAT17(uVar2,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 in_stack_ffffffffffffff20);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffef0,type,(char *)in_stack_fffffffffffffee0,
                 line,(char *)in_stack_fffffffffffffed0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar5,in_stack_ffffffffffffff40),
                 (Message *)in_stack_ffffffffffffff38);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffec0));
      std::__cxx11::string::~string(local_f0);
      testing::Message::~Message((Message *)0x10d0e2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d16d);
    local_a4 = 0;
  }
  KtxTexture<ktxTexture1>::~KtxTexture(in_stack_fffffffffffffed0);
  StreambufStream::~StreambufStream(this_00);
  return;
}

Assistant:

TEST_F(ktxStreamTest, CanCreateKtx1FromCppStream)
{
    StreambufStream ktx1Stream{std::move(_ktx1Streambuf), std::ios::in};
    KtxTexture<ktxTexture1> texture1;

    KTX_error_code err = ktxTexture1_CreateFromStream(ktx1Stream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                                      texture1.pHandle());
    EXPECT_EQ(err, KTX_SUCCESS) << "Failed to create KTX1 from C++ stream: " << ktxErrorString(err);
    ASSERT_NE(texture1, nullptr) << "Newly-created KTX1 is null";
    EXPECT_TRUE(ktx1Stream.destructed()) << "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)";
}